

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-graphics.cpp
# Opt level: O2

string * __thiscall
Game::Graphics::GameEndScreenOverlay_abi_cxx11_
          (string *__return_storage_ptr__,Graphics *this,end_screen_display_data_t *esdd)

{
  Graphics GVar1;
  Graphics GVar2;
  code *f;
  ostringstream str_os;
  string asStack_328 [32];
  ostringstream local_308 [376];
  ostringstream local_190 [376];
  
  GVar1 = this[1];
  GVar2 = *this;
  std::__cxx11::ostringstream::ostringstream(local_308);
  if (GVar2 == (Graphics)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    f = GameOverPrompt_abi_cxx11_;
    if (GVar1 != (Graphics)0x0) {
      f = YouWinPrompt_abi_cxx11_;
    }
    DrawAlways<std::__cxx11::string(*)()>((ostream *)local_190,f);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_190);
    std::operator<<((ostream *)local_308,asStack_328);
    std::__cxx11::string::~string(asStack_328);
  }
  else {
    DrawAlways<std::__cxx11::string(*)()>((ostream *)local_308,EndOfEndlessPrompt_abi_cxx11_);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_308);
  return __return_storage_ptr__;
}

Assistant:

std::string GameEndScreenOverlay(end_screen_display_data_t esdd) {
  enum EndScreenDisplayDataFields {
    IDX_FLAG_WIN,
    IDX_FLAG_ENDLESS_MODE,
    MAX_ENDSCREENDISPLAYDATA_INDEXES
  };
  const auto did_win = std::get<IDX_FLAG_WIN>(esdd);
  const auto is_endless_mode = std::get<IDX_FLAG_ENDLESS_MODE>(esdd);

  std::ostringstream str_os;
  const auto standardWinLosePrompt = [=] {
    std::ostringstream str_os;
    DrawOnlyWhen(str_os, did_win, YouWinPrompt);
    // else..
    DrawOnlyWhen(str_os, !did_win, GameOverPrompt);
    return str_os.str();
  };
  DrawOnlyWhen(str_os, !is_endless_mode, standardWinLosePrompt);
  // else..
  DrawOnlyWhen(str_os, is_endless_mode, EndOfEndlessPrompt);
  return str_os.str();
}